

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.h
# Opt level: O2

VRDataIndex * __thiscall
MinVR::VRDataQueueItem::getData(VRDataIndex *__return_storage_ptr__,VRDataQueueItem *this)

{
  string local_30;
  
  if (this->_dataIndex == (VRDataIndex *)0x0) {
    std::__cxx11::string::string((string *)&local_30,(string *)&this->_serialData);
    VRDataIndex::VRDataIndex(__return_storage_ptr__,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    VRDataIndex::VRDataIndex(__return_storage_ptr__,this->_dataIndex);
  }
  return __return_storage_ptr__;
}

Assistant:

VRDataIndex getData() const {
    if (_dataIndex) {
      return *_dataIndex;
    } else {
      return VRDataIndex(_serialData);
    }
  }